

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

void prvTidyoutBOM(StreamOut *out)

{
  if (((uint)out->encoding < 0xc) && ((0xe10U >> (out->encoding & 0x1fU) & 1) != 0)) {
    prvTidyWriteChar(0xfeff,out);
    return;
  }
  return;
}

Assistant:

void TY_(outBOM)( StreamOut *out )
{
    if ( out->encoding == UTF8
         || out->encoding == UTF16LE
         || out->encoding == UTF16BE
         || out->encoding == UTF16
       )
    {
        /* this will take care of encoding the BOM correctly */
        TY_(WriteChar)( UNICODE_BOM, out );
    }
}